

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_internal_validate(roaring_bitmap_t *r,char **reason)

{
  ushort uVar1;
  _Bool _Var2;
  long *in_RSI;
  char **in_RDI;
  int32_t i_1;
  int32_t i;
  uint32_t prev_key;
  roaring_array_t *ra;
  char *reason_local;
  int local_34;
  int local_30;
  uint8_t in_stack_ffffffffffffffe7;
  _Bool local_1;
  
  if (in_RSI == (long *)0x0) {
    in_RSI = (long *)&stack0xffffffffffffffe0;
  }
  *in_RSI = 0;
  if (*(int *)in_RDI < 0) {
    *in_RSI = (long)"negative size";
    local_1 = false;
  }
  else if (*(int *)((long)in_RDI + 4) < 0) {
    *in_RSI = (long)"negative allocation size";
    local_1 = false;
  }
  else if (*(int *)((long)in_RDI + 4) < *(int *)in_RDI) {
    *in_RSI = (long)"more containers than allocated space";
    local_1 = false;
  }
  else if (((ulong)in_RDI[4] & 0xfc) == 0) {
    if (*(int *)in_RDI == 0) {
      local_1 = true;
    }
    else if (in_RDI[2] == (char *)0x0) {
      *in_RSI = (long)"keys is NULL";
      local_1 = false;
    }
    else if (in_RDI[3] == (char *)0x0) {
      *in_RSI = (long)"typecodes is NULL";
      local_1 = false;
    }
    else if (in_RDI[1] == (char *)0x0) {
      *in_RSI = (long)"containers is NULL";
      local_1 = false;
    }
    else {
      uVar1 = *(ushort *)in_RDI[2];
      for (local_30 = 1; local_30 < *(int *)in_RDI; local_30 = local_30 + 1) {
        if (*(ushort *)(in_RDI[2] + (long)local_30 * 2) <= uVar1) {
          *in_RSI = (long)"keys not strictly increasing";
          return false;
        }
        uVar1 = *(ushort *)(in_RDI[2] + (long)local_30 * 2);
      }
      for (local_34 = 0; local_34 < *(int *)in_RDI; local_34 = local_34 + 1) {
        _Var2 = container_internal_validate(in_RSI,in_stack_ffffffffffffffe7,in_RDI);
        if (!_Var2) {
          if (*in_RSI == 0) {
            *in_RSI = (long)"container failed to validate but no reason given";
          }
          return false;
        }
      }
      local_1 = true;
    }
  }
  else {
    *in_RSI = (long)"invalid flags";
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool roaring_bitmap_internal_validate(const roaring_bitmap_t *r,
                                      const char **reason) {
    const char *reason_local;
    if (reason == NULL) {
        // Always allow assigning through *reason
        reason = &reason_local;
    }
    *reason = NULL;
    const roaring_array_t *ra = &r->high_low_container;
    if (ra->size < 0) {
        *reason = "negative size";
        return false;
    }
    if (ra->allocation_size < 0) {
        *reason = "negative allocation size";
        return false;
    }
    if (ra->size > ra->allocation_size) {
        *reason = "more containers than allocated space";
        return false;
    }
    if (ra->flags & ~(ROARING_FLAG_COW | ROARING_FLAG_FROZEN)) {
        *reason = "invalid flags";
        return false;
    }
    if (ra->size == 0) {
        return true;
    }

    if (ra->keys == NULL) {
        *reason = "keys is NULL";
        return false;
    }
    if (ra->typecodes == NULL) {
        *reason = "typecodes is NULL";
        return false;
    }
    if (ra->containers == NULL) {
        *reason = "containers is NULL";
        return false;
    }

    uint32_t prev_key = ra->keys[0];
    for (int32_t i = 1; i < ra->size; ++i) {
        if (ra->keys[i] <= prev_key) {
            *reason = "keys not strictly increasing";
            return false;
        }
        prev_key = ra->keys[i];
    }

    for (int32_t i = 0; i < ra->size; ++i) {
        if (!container_internal_validate(ra->containers[i], ra->typecodes[i],
                                         reason)) {
            // reason should already be set
            if (*reason == NULL) {
                *reason = "container failed to validate but no reason given";
            }
            return false;
        }
    }

    return true;
}